

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O2

DdNode * cuddZddComplement(DdManager *dd,DdNode *node)

{
  int *piVar1;
  DdNode *n;
  DdNode *n_00;
  DdNode *zdd_I;
  DdNode *local_28;
  
  local_28 = cuddCacheLookup1Zdd(dd,cuddZddComplement,node);
  if (local_28 == (DdNode *)0x0) {
    n = cuddMakeBddFromZddCover(dd,node);
    if (n != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      n_00 = cuddZddIsop(dd,(DdNode *)((ulong)n ^ 1),(DdNode *)((ulong)n ^ 1),&local_28);
      if (n_00 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(((ulong)local_28 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDeref(dd,n_00);
        cuddCacheInsert1(dd,cuddZddComplement,node,local_28);
        piVar1 = (int *)(((ulong)local_28 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return local_28;
      }
      Cudd_RecursiveDeref(dd,n);
    }
    local_28 = (DdNode *)0x0;
  }
  return local_28;
}

Assistant:

DdNode  *
cuddZddComplement(
  DdManager * dd,
  DdNode *node)
{
    DdNode      *b, *isop, *zdd_I;

    /* Check cache */
    zdd_I = cuddCacheLookup1Zdd(dd, cuddZddComplement, node);
    if (zdd_I)
        return(zdd_I);

    b = cuddMakeBddFromZddCover(dd, node);
    if (!b)
        return(NULL);
    cuddRef(b);
    isop = cuddZddIsop(dd, Cudd_Not(b), Cudd_Not(b), &zdd_I);
    if (!isop) {
        Cudd_RecursiveDeref(dd, b);
        return(NULL);
    }
    cuddRef(isop);
    cuddRef(zdd_I);
    Cudd_RecursiveDeref(dd, b);
    Cudd_RecursiveDeref(dd, isop);

    cuddCacheInsert1(dd, cuddZddComplement, node, zdd_I);
    cuddDeref(zdd_I);
    return(zdd_I);
}